

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O0

void gen_random(char *s,int len)

{
  int iVar1;
  uint *__seed;
  int in_ESI;
  long in_RDI;
  int i;
  int local_10;
  
  for (local_10 = 0; local_10 < in_ESI; local_10 = local_10 + 1) {
    __seed = (uint *)_ZTW9rand_seed();
    iVar1 = rand_r(__seed);
    *(char *)(in_RDI + local_10) =
         "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"[(ulong)(long)iVar1 % 0x3e]
    ;
  }
  *(undefined1 *)(in_RDI + in_ESI) = 0;
  return;
}

Assistant:

inline void gen_random(char *s, const int len) {
    static const char alphanum[] =
        "0123456789"
        "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
        "abcdefghijklmnopqrstuvwxyz";

    for (int i = 0; i < len; ++i) {
        s[i] = alphanum[rand_r(&rand_seed) % (sizeof(alphanum) - 1)];
    }

    s[len] = 0;
}